

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O0

bool __thiscall
google::protobuf::compiler::Parser::ParsePackage
          (Parser *this,FileDescriptorProto *file,LocationRecorder *root_location,
          FileDescriptorProto *containing_file)

{
  bool bVar1;
  string *psVar2;
  undefined1 local_a8 [8];
  string identifier;
  undefined1 local_80 [8];
  LocationRecorder location;
  allocator local_51;
  string local_50;
  FileDescriptorProto *local_30;
  FileDescriptorProto *containing_file_local;
  LocationRecorder *root_location_local;
  FileDescriptorProto *file_local;
  Parser *this_local;
  
  local_30 = containing_file;
  containing_file_local = (FileDescriptorProto *)root_location;
  root_location_local = (LocationRecorder *)file;
  file_local = (FileDescriptorProto *)this;
  bVar1 = FileDescriptorProto::has_package(file);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_50,"Multiple package definitions.",&local_51);
    AddError(this,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::allocator<char>::~allocator((allocator<char> *)&local_51);
    FileDescriptorProto::clear_package((FileDescriptorProto *)root_location_local);
  }
  LocationRecorder::LocationRecorder
            ((LocationRecorder *)local_80,(LocationRecorder *)containing_file_local,2);
  LocationRecorder::RecordLegacyLocation
            ((LocationRecorder *)local_80,(Message *)root_location_local,NAME);
  bVar1 = Consume(this,"package");
  if (bVar1) {
    do {
      std::__cxx11::string::string((string *)local_a8);
      bVar1 = ConsumeIdentifier(this,(string *)local_a8,"Expected identifier.");
      if (bVar1) {
        psVar2 = FileDescriptorProto::mutable_package_abi_cxx11_
                           ((FileDescriptorProto *)root_location_local);
        std::__cxx11::string::append((string *)psVar2);
        bVar1 = TryConsume(this,".");
        if (bVar1) {
          psVar2 = FileDescriptorProto::mutable_package_abi_cxx11_
                             ((FileDescriptorProto *)root_location_local);
          std::__cxx11::string::append((char *)psVar2);
          identifier.field_2._12_4_ = 0;
        }
        else {
          identifier.field_2._12_4_ = 3;
        }
      }
      else {
        this_local._7_1_ = 0;
        identifier.field_2._12_4_ = 1;
      }
      std::__cxx11::string::~string((string *)local_a8);
    } while (identifier.field_2._12_4_ == 0);
    if (identifier.field_2._12_4_ == 3) {
      bVar1 = ConsumeEndOfDeclaration(this,";",(LocationRecorder *)local_80);
      if (bVar1) {
        this_local._7_1_ = 1;
        identifier.field_2._12_4_ = 1;
      }
      else {
        this_local._7_1_ = 0;
        identifier.field_2._12_4_ = 1;
      }
    }
  }
  else {
    this_local._7_1_ = 0;
    identifier.field_2._12_4_ = 1;
  }
  LocationRecorder::~LocationRecorder((LocationRecorder *)local_80);
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool Parser::ParsePackage(FileDescriptorProto* file,
                          const LocationRecorder& root_location,
                          const FileDescriptorProto* containing_file) {
  if (file->has_package()) {
    AddError("Multiple package definitions.");
    // Don't append the new package to the old one.  Just replace it.  Not
    // that it really matters since this is an error anyway.
    file->clear_package();
  }

  LocationRecorder location(root_location,
                            FileDescriptorProto::kPackageFieldNumber);
  location.RecordLegacyLocation(file, DescriptorPool::ErrorCollector::NAME);

  DO(Consume("package"));

  while (true) {
    std::string identifier;
    DO(ConsumeIdentifier(&identifier, "Expected identifier."));
    file->mutable_package()->append(identifier);
    if (!TryConsume(".")) break;
    file->mutable_package()->append(".");
  }

  DO(ConsumeEndOfDeclaration(";", &location));

  return true;
}